

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

void __thiscall
ncnn::Mat::to_pixels_resize
          (Mat *this,uchar *pixels,int type,int target_width,int target_height,int target_stride)

{
  int in_ECX;
  uint in_EDX;
  long in_RDI;
  int in_R8D;
  Mat src_2;
  Mat src_1;
  Mat src;
  int type_to;
  int in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  int in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  Mat *in_stack_fffffffffffffeb0;
  uint local_104;
  Mat local_f8;
  Mat local_b8;
  Mat local_68;
  uint local_24;
  
  if ((*(int *)(in_RDI + 0x2c) == in_ECX) && (*(int *)(in_RDI + 0x30) == in_R8D)) {
    to_pixels(in_stack_fffffffffffffeb0,
              (uchar *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
              in_stack_fffffffffffffea4);
  }
  else {
    if ((in_EDX & 0xffff0000) == 0) {
      local_104 = in_EDX & 0xffff;
    }
    else {
      local_104 = (int)in_EDX >> 0x10;
    }
    local_24 = local_104;
    if ((local_104 == 1) || (local_104 == 2)) {
      Mat(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,
          CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),in_stack_fffffffffffffe9c,
          (Allocator *)0x1271ce);
      operator_cast_to_unsigned_char_(&local_68);
      to_pixels(in_stack_fffffffffffffeb0,
                (uchar *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                in_stack_fffffffffffffea4);
      operator_cast_to_unsigned_char_(&local_68);
      resize_bilinear_c3((uchar *)src_1.elemsize,src_1.refcount._4_4_,(int)src_1.refcount,
                         src_1.data._4_4_,(uchar *)src_2.cstep,src_2.c,(int)src_1.allocator,
                         src_1.dims);
      ~Mat((Mat *)0x12725e);
    }
    else if (local_104 == 3) {
      Mat(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,
          CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),in_stack_fffffffffffffe9c,
          (Allocator *)0x1272c4);
      operator_cast_to_unsigned_char_(&local_b8);
      to_pixels(in_stack_fffffffffffffeb0,
                (uchar *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                in_stack_fffffffffffffea4);
      operator_cast_to_unsigned_char_(&local_b8);
      resize_bilinear_c1((uchar *)src_1.elemsize,src_1.refcount._4_4_,(int)src_1.refcount,
                         src_1.data._4_4_,(uchar *)src_2.cstep,src_2.c,(int)src_1.allocator,
                         src_1.dims);
      ~Mat((Mat *)0x12734f);
    }
    else if (local_104 == 4) {
      Mat(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,
          CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),in_stack_fffffffffffffe9c,
          (Allocator *)0x1273b2);
      operator_cast_to_unsigned_char_(&local_f8);
      to_pixels(in_stack_fffffffffffffeb0,
                (uchar *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                in_stack_fffffffffffffea4);
      operator_cast_to_unsigned_char_(&local_f8);
      resize_bilinear_c4((uchar *)src_1.elemsize,src_1.refcount._4_4_,(int)src_1.refcount,
                         src_1.data._4_4_,(uchar *)src_2.cstep,src_2.c,(int)src_1.allocator,
                         src_1.dims);
      ~Mat((Mat *)0x12743c);
    }
  }
  return;
}

Assistant:

void Mat::to_pixels_resize(unsigned char* pixels, int type, int target_width, int target_height, int target_stride) const
{
    if (w == target_width && h == target_height)
        return to_pixels(pixels, type);

    int type_to = (type & PIXEL_CONVERT_MASK) ? (type >> PIXEL_CONVERT_SHIFT) : (type & PIXEL_FORMAT_MASK);

    if (type_to == PIXEL_RGB || type_to == PIXEL_BGR)
    {
        Mat src(w, h, (size_t)3u, 3);

        to_pixels(src, type);

        resize_bilinear_c3(src, w, h, w * 3, pixels, target_width, target_height, target_stride);
    }
    else if (type_to == PIXEL_GRAY)
    {
        Mat src(w, h, (size_t)1u, 1);

        to_pixels(src, type);

        resize_bilinear_c1(src, w, h, w * 1, pixels, target_width, target_height, target_stride);
    }
    else if (type_to == PIXEL_RGBA)
    {
        Mat src(w, h, (size_t)4u, 4);

        to_pixels(src, type);

        resize_bilinear_c4(src, w, h, w * 4, pixels, target_width, target_height, target_stride);
    }
}